

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

parameter_trie_ptr __thiscall
boost::runtime::cla::rt_cla_detail::parameter_trie::get_subtrie(parameter_trie *this,char c)

{
  long lVar1;
  char cVar2;
  shared_count in_RDX;
  undefined7 in_register_00000031;
  long lVar3;
  long lVar4;
  parameter_trie_ptr pVar5;
  parameter_trie_ptr pVar6;
  
  lVar3 = CONCAT71(in_register_00000031,c) + 8;
  cVar2 = (char)in_RDX.pi_;
  lVar1 = lVar3;
  for (lVar4 = *(long *)(CONCAT71(in_register_00000031,c) + 0x10); lVar4 != 0;
      lVar4 = *(long *)(lVar4 + 0x10 + (ulong)(*(char *)(lVar4 + 0x20) < cVar2) * 8)) {
    if (cVar2 <= *(char *)(lVar4 + 0x20)) {
      lVar1 = lVar4;
    }
  }
  lVar4 = lVar3;
  if ((lVar1 != lVar3) && (lVar4 = lVar1, cVar2 < *(char *)(lVar1 + 0x20))) {
    lVar4 = lVar3;
  }
  if (lVar4 == lVar3) {
    *(undefined8 *)&(this->m_subtrie)._M_t._M_impl = 0;
    *(undefined8 *)&(this->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  }
  else {
    *(undefined8 *)&(this->m_subtrie)._M_t._M_impl = *(undefined8 *)(lVar4 + 0x28);
    lVar4 = *(long *)(lVar4 + 0x30);
    *(long *)&(this->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header = lVar4;
    if (lVar4 != 0) {
      LOCK();
      *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
      UNLOCK();
      pVar5.pn.pi_ = in_RDX.pi_;
      pVar5.px = this;
      return pVar5;
    }
  }
  pVar6.pn.pi_ = in_RDX.pi_;
  pVar6.px = this;
  return pVar6;
}

Assistant:

parameter_trie_ptr  get_subtrie( char c ) const
    {
        trie_per_char::const_iterator it = m_subtrie.find( c );

        return it != m_subtrie.end() ? it->second : parameter_trie_ptr();
    }